

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Scene *pSVar3;
  Ref<embree::Geometry> *pRVar4;
  Geometry *pGVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 *puVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 (*pauVar36) [16];
  int iVar37;
  uint uVar38;
  AABBNodeMB4D *node1;
  ulong uVar39;
  long lVar40;
  long lVar41;
  uint uVar42;
  undefined1 *puVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  long lVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  long lVar63;
  ulong uVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar105;
  float fVar111;
  float fVar112;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [64];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [64];
  float fVar124;
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar132;
  undefined1 auVar128 [32];
  float fVar130;
  float fVar131;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar129 [64];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  float fVar140;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  float fVar146;
  float fVar148;
  float fVar149;
  undefined1 auVar147 [32];
  float fVar151;
  float fVar152;
  undefined1 auVar150 [32];
  float fVar153;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float fVar160;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 (*local_16e0) [16];
  RTCFilterFunctionNArguments local_1610;
  undefined1 local_15e0 [32];
  undefined1 local_15b0 [16];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  float local_1520;
  float fStack_151c;
  float fStack_1518;
  float fStack_1514;
  float fStack_1510;
  float fStack_150c;
  float fStack_1508;
  float fStack_1504;
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  float local_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float local_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float local_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  undefined1 local_13b0 [16];
  undefined1 local_13a0 [16];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined1 local_1300 [16];
  undefined4 uStack_12f0;
  undefined4 uStack_12ec;
  undefined4 uStack_12e8;
  undefined4 uStack_12e4;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  float local_11c0 [4];
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  undefined4 uStack_11a4;
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [8];
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  undefined4 uStack_1104;
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined4 local_1020;
  undefined4 uStack_101c;
  undefined4 uStack_1018;
  undefined4 uStack_1014;
  undefined4 uStack_1010;
  undefined4 uStack_100c;
  undefined4 uStack_1008;
  undefined4 uStack_1004;
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  local_16e0 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1390._4_4_ = uVar1;
  local_1390._0_4_ = uVar1;
  local_1390._8_4_ = uVar1;
  local_1390._12_4_ = uVar1;
  auVar123 = ZEXT1664(local_1390);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_13a0._4_4_ = uVar1;
  local_13a0._0_4_ = uVar1;
  local_13a0._8_4_ = uVar1;
  local_13a0._12_4_ = uVar1;
  auVar129 = ZEXT1664(local_13a0);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_13b0._4_4_ = uVar1;
  local_13b0._0_4_ = uVar1;
  local_13b0._8_4_ = uVar1;
  local_13b0._12_4_ = uVar1;
  auVar139 = ZEXT1664(local_13b0);
  local_13f0 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1400 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1410 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_13c0 = local_13f0 * 0.99999964;
  local_13d0 = local_1400 * 0.99999964;
  local_13e0 = local_1410 * 0.99999964;
  local_13f0 = local_13f0 * 1.0000004;
  local_1400 = local_1400 * 1.0000004;
  local_1410 = local_1410 * 1.0000004;
  uVar60 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar64 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar37 = (tray->tnear).field_0.i[k];
  local_15b0._4_4_ = iVar37;
  local_15b0._0_4_ = iVar37;
  local_15b0._8_4_ = iVar37;
  local_15b0._12_4_ = iVar37;
  auVar120 = ZEXT1664(local_15b0);
  puVar43 = mm_lookupmask_ps;
  local_1100._16_16_ = mm_lookupmask_ps._240_16_;
  local_1100._0_16_ = mm_lookupmask_ps._0_16_;
  iVar37 = (tray->tfar).field_0.i[k];
  auVar69 = ZEXT1664(CONCAT412(iVar37,CONCAT48(iVar37,CONCAT44(iVar37,iVar37))));
  iVar37 = 1 << ((uint)k & 0x1f);
  auVar73._4_4_ = iVar37;
  auVar73._0_4_ = iVar37;
  auVar73._8_4_ = iVar37;
  auVar73._12_4_ = iVar37;
  auVar73._16_4_ = iVar37;
  auVar73._20_4_ = iVar37;
  auVar73._24_4_ = iVar37;
  auVar73._28_4_ = iVar37;
  auVar74 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar73 = vpand_avx2(auVar73,auVar74);
  local_1140 = vpcmpeqd_avx2(auVar73,auVar74);
  auVar79._8_4_ = 0x3f800000;
  auVar79._0_8_ = &DAT_3f8000003f800000;
  auVar79._12_4_ = 0x3f800000;
  auVar79._16_4_ = 0x3f800000;
  auVar79._20_4_ = 0x3f800000;
  auVar79._24_4_ = 0x3f800000;
  auVar79._28_4_ = 0x3f800000;
  auVar74._8_4_ = 0xbf800000;
  auVar74._0_8_ = 0xbf800000bf800000;
  auVar74._12_4_ = 0xbf800000;
  auVar74._16_4_ = 0xbf800000;
  auVar74._20_4_ = 0xbf800000;
  auVar74._24_4_ = 0xbf800000;
  auVar74._28_4_ = 0xbf800000;
  _local_1120 = vblendvps_avx(auVar79,auVar74,local_1100);
  fVar140 = local_13c0;
  fVar143 = local_13c0;
  fVar144 = local_13c0;
  fVar145 = local_13c0;
  fVar146 = local_13d0;
  fVar148 = local_13d0;
  fVar149 = local_13d0;
  fVar105 = local_13d0;
  fVar111 = local_13e0;
  fVar112 = local_13e0;
  fVar113 = local_13e0;
  fVar114 = local_13e0;
  fVar115 = local_13f0;
  fVar116 = local_13f0;
  fVar151 = local_13f0;
  fVar152 = local_13f0;
  fVar153 = local_1400;
  fVar157 = local_1400;
  fVar158 = local_1400;
  fVar159 = local_1400;
  fVar160 = local_1410;
  fVar163 = local_1410;
  fVar164 = local_1410;
  fVar165 = local_1410;
  fStack_140c = local_1410;
  fStack_1408 = local_1410;
  fStack_1404 = local_1410;
  fStack_13fc = local_1400;
  fStack_13f8 = local_1400;
  fStack_13f4 = local_1400;
  fStack_13ec = local_13f0;
  fStack_13e8 = local_13f0;
  fStack_13e4 = local_13f0;
  fStack_13dc = local_13e0;
  fStack_13d8 = local_13e0;
  fStack_13d4 = local_13e0;
  fStack_13cc = local_13d0;
  fStack_13c8 = local_13d0;
  fStack_13c4 = local_13d0;
  fStack_13bc = local_13c0;
  fStack_13b8 = local_13c0;
  fStack_13b4 = local_13c0;
  do {
    do {
      do {
        if (local_16e0 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar36 = local_16e0 + -1;
        local_16e0 = local_16e0 + -1;
      } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar36 + 8));
      uVar62 = *(ulong *)*local_16e0;
      do {
        if ((uVar62 & 8) == 0) {
          uVar39 = uVar62 & 0xfffffffffffffff0;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0xe0);
          auVar70._4_4_ = uVar1;
          auVar70._0_4_ = uVar1;
          auVar70._8_4_ = uVar1;
          auVar70._12_4_ = uVar1;
          auVar71 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + uVar60),auVar70,
                                    *(undefined1 (*) [16])(uVar39 + 0x20 + uVar60));
          auVar71 = vsubps_avx(auVar71,auVar123._0_16_);
          auVar82._0_4_ = fVar140 * auVar71._0_4_;
          auVar82._4_4_ = fVar143 * auVar71._4_4_;
          auVar82._8_4_ = fVar144 * auVar71._8_4_;
          auVar82._12_4_ = fVar145 * auVar71._12_4_;
          auVar71 = vmaxps_avx(auVar120._0_16_,auVar82);
          auVar82 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + uVar45),auVar70,
                                    *(undefined1 (*) [16])(uVar39 + 0x20 + uVar45));
          auVar82 = vsubps_avx(auVar82,auVar129._0_16_);
          auVar90._0_4_ = fVar146 * auVar82._0_4_;
          auVar90._4_4_ = fVar148 * auVar82._4_4_;
          auVar90._8_4_ = fVar149 * auVar82._8_4_;
          auVar90._12_4_ = fVar105 * auVar82._12_4_;
          auVar82 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + uVar64),auVar70,
                                    *(undefined1 (*) [16])(uVar39 + 0x20 + uVar64));
          auVar82 = vsubps_avx(auVar82,auVar139._0_16_);
          auVar97._0_4_ = fVar111 * auVar82._0_4_;
          auVar97._4_4_ = fVar112 * auVar82._4_4_;
          auVar97._8_4_ = fVar113 * auVar82._8_4_;
          auVar97._12_4_ = fVar114 * auVar82._12_4_;
          auVar82 = vmaxps_avx(auVar90,auVar97);
          local_1300 = vmaxps_avx(auVar71,auVar82);
          auVar71 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + (uVar60 ^ 0x10)),auVar70,
                                    *(undefined1 (*) [16])(uVar39 + 0x20 + (uVar60 ^ 0x10)));
          auVar71 = vsubps_avx(auVar71,auVar123._0_16_);
          auVar91._0_4_ = fVar115 * auVar71._0_4_;
          auVar91._4_4_ = fVar116 * auVar71._4_4_;
          auVar91._8_4_ = fVar151 * auVar71._8_4_;
          auVar91._12_4_ = fVar152 * auVar71._12_4_;
          auVar71 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + (uVar45 ^ 0x10)),auVar70,
                                    *(undefined1 (*) [16])(uVar39 + 0x20 + (uVar45 ^ 0x10)));
          auVar71 = vsubps_avx(auVar71,auVar129._0_16_);
          auVar98._0_4_ = fVar153 * auVar71._0_4_;
          auVar98._4_4_ = fVar157 * auVar71._4_4_;
          auVar98._8_4_ = fVar158 * auVar71._8_4_;
          auVar98._12_4_ = fVar159 * auVar71._12_4_;
          auVar71 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar39 + 0x80 + (uVar64 ^ 0x10)),auVar70,
                                    *(undefined1 (*) [16])(uVar39 + 0x20 + (uVar64 ^ 0x10)));
          auVar71 = vsubps_avx(auVar71,auVar139._0_16_);
          auVar106._0_4_ = fVar160 * auVar71._0_4_;
          auVar106._4_4_ = fVar163 * auVar71._4_4_;
          auVar106._8_4_ = fVar164 * auVar71._8_4_;
          auVar106._12_4_ = fVar165 * auVar71._12_4_;
          auVar71 = vminps_avx(auVar98,auVar106);
          auVar82 = vminps_avx(auVar69._0_16_,auVar91);
          auVar71 = vminps_avx(auVar82,auVar71);
          if (((uint)uVar62 & 7) == 6) {
            auVar82 = vcmpps_avx(local_1300,auVar71,2);
            auVar71 = vcmpps_avx(*(undefined1 (*) [16])(uVar39 + 0xe0),auVar70,2);
            auVar70 = vcmpps_avx(auVar70,*(undefined1 (*) [16])(uVar39 + 0xf0),1);
            auVar71 = vandps_avx(auVar71,auVar70);
            auVar71 = vandps_avx(auVar71,auVar82);
          }
          else {
            auVar71 = vcmpps_avx(local_1300,auVar71,2);
          }
          auVar71 = vpslld_avx(auVar71,0x1f);
          uVar42 = vmovmskps_avx(auVar71);
          puVar43 = (undefined1 *)(ulong)uVar42;
        }
        if ((uVar62 & 8) == 0) {
          if (puVar43 == (undefined1 *)0x0) {
            iVar37 = 4;
          }
          else {
            uVar39 = uVar62 & 0xfffffffffffffff0;
            lVar41 = 0;
            for (puVar17 = puVar43; ((ulong)puVar17 & 1) == 0;
                puVar17 = (undefined1 *)((ulong)puVar17 >> 1 | 0x8000000000000000)) {
              lVar41 = lVar41 + 1;
            }
            iVar37 = 0;
            uVar51 = (ulong)(puVar43 + -1) & (ulong)puVar43;
            uVar62 = *(ulong *)(uVar39 + lVar41 * 8);
            if (uVar51 != 0) {
              uVar42 = *(uint *)(local_1300 + lVar41 * 4);
              lVar41 = 0;
              for (uVar44 = uVar51; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
                lVar41 = lVar41 + 1;
              }
              uVar51 = uVar51 - 1 & uVar51;
              uVar44 = *(ulong *)(uVar39 + lVar41 * 8);
              uVar38 = *(uint *)(local_1300 + lVar41 * 4);
              if (uVar51 == 0) {
                if (uVar42 < uVar38) {
                  *(ulong *)*local_16e0 = uVar44;
                  *(uint *)(*local_16e0 + 8) = uVar38;
                  local_16e0 = local_16e0 + 1;
                }
                else {
                  *(ulong *)*local_16e0 = uVar62;
                  *(uint *)(*local_16e0 + 8) = uVar42;
                  uVar62 = uVar44;
                  local_16e0 = local_16e0 + 1;
                }
              }
              else {
                auVar71._8_8_ = 0;
                auVar71._0_8_ = uVar62;
                auVar71 = vpunpcklqdq_avx(auVar71,ZEXT416(uVar42));
                auVar83._8_8_ = 0;
                auVar83._0_8_ = uVar44;
                auVar82 = vpunpcklqdq_avx(auVar83,ZEXT416(uVar38));
                lVar41 = 0;
                for (uVar62 = uVar51; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000)
                {
                  lVar41 = lVar41 + 1;
                }
                uVar51 = uVar51 - 1 & uVar51;
                auVar92._8_8_ = 0;
                auVar92._0_8_ = *(ulong *)(uVar39 + lVar41 * 8);
                auVar90 = vpunpcklqdq_avx(auVar92,ZEXT416(*(uint *)(local_1300 + lVar41 * 4)));
                auVar70 = vpcmpgtd_avx(auVar82,auVar71);
                if (uVar51 == 0) {
                  auVar91 = vpshufd_avx(auVar70,0xaa);
                  auVar70 = vblendvps_avx(auVar82,auVar71,auVar91);
                  auVar71 = vblendvps_avx(auVar71,auVar82,auVar91);
                  auVar82 = vpcmpgtd_avx(auVar90,auVar70);
                  auVar91 = vpshufd_avx(auVar82,0xaa);
                  auVar82 = vblendvps_avx(auVar90,auVar70,auVar91);
                  auVar70 = vblendvps_avx(auVar70,auVar90,auVar91);
                  auVar90 = vpcmpgtd_avx(auVar70,auVar71);
                  auVar91 = vpshufd_avx(auVar90,0xaa);
                  auVar90 = vblendvps_avx(auVar70,auVar71,auVar91);
                  auVar71 = vblendvps_avx(auVar71,auVar70,auVar91);
                  *local_16e0 = auVar71;
                  local_16e0[1] = auVar90;
                  uVar62 = auVar82._0_8_;
                  local_16e0 = local_16e0 + 2;
                }
                else {
                  lVar41 = 0;
                  for (; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
                    lVar41 = lVar41 + 1;
                  }
                  auVar107._8_8_ = 0;
                  auVar107._0_8_ = *(ulong *)(uVar39 + lVar41 * 8);
                  auVar97 = vpunpcklqdq_avx(auVar107,ZEXT416(*(uint *)(local_1300 + lVar41 * 4)));
                  auVar91 = vpshufd_avx(auVar70,0xaa);
                  auVar70 = vblendvps_avx(auVar82,auVar71,auVar91);
                  auVar71 = vblendvps_avx(auVar71,auVar82,auVar91);
                  auVar82 = vpcmpgtd_avx(auVar97,auVar90);
                  auVar91 = vpshufd_avx(auVar82,0xaa);
                  auVar82 = vblendvps_avx(auVar97,auVar90,auVar91);
                  auVar90 = vblendvps_avx(auVar90,auVar97,auVar91);
                  auVar91 = vpcmpgtd_avx(auVar90,auVar71);
                  auVar97 = vpshufd_avx(auVar91,0xaa);
                  auVar91 = vblendvps_avx(auVar90,auVar71,auVar97);
                  auVar71 = vblendvps_avx(auVar71,auVar90,auVar97);
                  auVar90 = vpcmpgtd_avx(auVar82,auVar70);
                  auVar97 = vpshufd_avx(auVar90,0xaa);
                  auVar90 = vblendvps_avx(auVar82,auVar70,auVar97);
                  auVar82 = vblendvps_avx(auVar70,auVar82,auVar97);
                  auVar70 = vpcmpgtd_avx(auVar91,auVar82);
                  auVar97 = vpshufd_avx(auVar70,0xaa);
                  auVar70 = vblendvps_avx(auVar91,auVar82,auVar97);
                  auVar82 = vblendvps_avx(auVar82,auVar91,auVar97);
                  *local_16e0 = auVar71;
                  local_16e0[1] = auVar82;
                  local_16e0[2] = auVar70;
                  auVar120 = ZEXT1664(local_15b0);
                  uVar62 = auVar90._0_8_;
                  local_16e0 = local_16e0 + 3;
                }
              }
            }
          }
        }
        else {
          iVar37 = 6;
        }
      } while (iVar37 == 0);
    } while (iVar37 != 6);
    uVar39 = (ulong)((uint)uVar62 & 0xf);
    if (uVar39 != 8) {
      uVar62 = uVar62 & 0xfffffffffffffff0;
      lVar41 = 0;
      do {
        lVar40 = lVar41 * 0x60;
        pSVar3 = context->scene;
        pRVar4 = (pSVar3->geometries).items;
        pGVar5 = pRVar4[*(uint *)(uVar62 + 0x40 + lVar40)].ptr;
        fVar140 = (pGVar5->time_range).lower;
        fVar140 = pGVar5->fnumTimeSegments *
                  ((*(float *)(ray + k * 4 + 0xe0) - fVar140) /
                  ((pGVar5->time_range).upper - fVar140));
        auVar71 = vroundss_avx(ZEXT416((uint)fVar140),ZEXT416((uint)fVar140),9);
        auVar71 = vminss_avx(auVar71,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
        auVar65 = vmaxss_avx(ZEXT816(0) << 0x20,auVar71);
        iVar37 = (int)auVar65._0_4_;
        lVar53 = (long)iVar37 * 0x38;
        lVar6 = *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar53);
        uVar52 = (ulong)*(uint *)(uVar62 + 4 + lVar40);
        auVar71 = *(undefined1 (*) [16])(lVar6 + (ulong)*(uint *)(uVar62 + lVar40) * 4);
        uVar51 = (ulong)*(uint *)(uVar62 + 0x10 + lVar40);
        auVar82 = *(undefined1 (*) [16])(lVar6 + uVar51 * 4);
        uVar44 = (ulong)*(uint *)(uVar62 + 0x20 + lVar40);
        auVar70 = *(undefined1 (*) [16])(lVar6 + uVar44 * 4);
        uVar46 = (ulong)*(uint *)(uVar62 + 0x30 + lVar40);
        auVar90 = *(undefined1 (*) [16])(lVar6 + uVar46 * 4);
        lVar6 = *(long *)&pRVar4[*(uint *)(uVar62 + 0x44 + lVar40)].ptr[2].numPrimitives;
        lVar7 = *(long *)(lVar6 + lVar53);
        auVar91 = *(undefined1 (*) [16])(lVar7 + uVar52 * 4);
        uVar47 = (ulong)*(uint *)(uVar62 + 0x14 + lVar40);
        auVar97 = *(undefined1 (*) [16])(lVar7 + uVar47 * 4);
        uVar48 = (ulong)*(uint *)(uVar62 + 0x24 + lVar40);
        auVar98 = *(undefined1 (*) [16])(lVar7 + uVar48 * 4);
        uVar49 = (ulong)*(uint *)(uVar62 + 0x34 + lVar40);
        auVar106 = *(undefined1 (*) [16])(lVar7 + uVar49 * 4);
        lVar7 = *(long *)&pRVar4[*(uint *)(uVar62 + 0x48 + lVar40)].ptr[2].numPrimitives;
        lVar8 = *(long *)(lVar7 + lVar53);
        uVar50 = (ulong)*(uint *)(uVar62 + 8 + lVar40);
        auVar83 = *(undefined1 (*) [16])(lVar8 + uVar50 * 4);
        uVar55 = (ulong)*(uint *)(uVar62 + 0x18 + lVar40);
        auVar92 = *(undefined1 (*) [16])(lVar8 + uVar55 * 4);
        uVar56 = (ulong)*(uint *)(uVar62 + 0x28 + lVar40);
        auVar107 = *(undefined1 (*) [16])(lVar8 + uVar56 * 4);
        uVar57 = (ulong)*(uint *)(uVar62 + 0x38 + lVar40);
        auVar93 = *(undefined1 (*) [16])(lVar8 + uVar57 * 4);
        fVar140 = fVar140 - auVar65._0_4_;
        lVar8 = *(long *)&pRVar4[*(uint *)(uVar62 + 0x4c + lVar40)].ptr[2].numPrimitives;
        lVar53 = *(long *)(lVar8 + lVar53);
        uVar54 = (ulong)*(uint *)(uVar62 + 0xc + lVar40);
        auVar65 = *(undefined1 (*) [16])(lVar53 + uVar54 * 4);
        uVar59 = (ulong)*(uint *)(uVar62 + 0x1c + lVar40);
        auVar84 = *(undefined1 (*) [16])(lVar53 + uVar59 * 4);
        auVar121 = vunpcklps_avx(auVar71,auVar83);
        auVar83 = vunpckhps_avx(auVar71,auVar83);
        auVar108 = vunpcklps_avx(auVar91,auVar65);
        auVar91 = vunpckhps_avx(auVar91,auVar65);
        uVar58 = (ulong)*(uint *)(uVar62 + 0x2c + lVar40);
        auVar71 = *(undefined1 (*) [16])(lVar53 + uVar58 * 4);
        auVar65 = vunpcklps_avx(auVar83,auVar91);
        local_1330 = vunpcklps_avx(auVar121,auVar108);
        auVar91 = vunpckhps_avx(auVar121,auVar108);
        auVar121 = vunpcklps_avx(auVar82,auVar92);
        auVar83 = vunpckhps_avx(auVar82,auVar92);
        auVar92 = vunpcklps_avx(auVar97,auVar84);
        auVar97 = vunpckhps_avx(auVar97,auVar84);
        uVar61 = (ulong)*(uint *)(uVar62 + 0x3c + lVar40);
        auVar82 = *(undefined1 (*) [16])(lVar53 + uVar61 * 4);
        auVar83 = vunpcklps_avx(auVar83,auVar97);
        auVar84 = vunpcklps_avx(auVar121,auVar92);
        auVar97 = vunpckhps_avx(auVar121,auVar92);
        auVar92 = vunpcklps_avx(auVar70,auVar107);
        auVar70 = vunpckhps_avx(auVar70,auVar107);
        auVar107 = vunpcklps_avx(auVar98,auVar71);
        auVar98 = vunpckhps_avx(auVar98,auVar71);
        lVar63 = (long)(iVar37 + 1) * 0x38;
        lVar53 = *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar63);
        auVar71 = *(undefined1 (*) [16])(lVar53 + (ulong)*(uint *)(uVar62 + lVar40) * 4);
        local_1340 = vunpcklps_avx(auVar70,auVar98);
        auVar121 = vunpcklps_avx(auVar92,auVar107);
        local_1380 = vunpckhps_avx(auVar92,auVar107);
        auVar98 = vunpcklps_avx(auVar90,auVar93);
        auVar70 = vunpckhps_avx(auVar90,auVar93);
        auVar92 = vunpcklps_avx(auVar106,auVar82);
        auVar90 = vunpckhps_avx(auVar106,auVar82);
        lVar7 = *(long *)(lVar7 + lVar63);
        auVar82 = *(undefined1 (*) [16])(lVar7 + uVar50 * 4);
        local_1350 = vunpcklps_avx(auVar70,auVar90);
        local_1360 = vunpcklps_avx(auVar98,auVar92);
        local_1370 = vunpckhps_avx(auVar98,auVar92);
        lVar6 = *(long *)(lVar6 + lVar63);
        auVar90 = vunpcklps_avx(auVar71,auVar82);
        auVar70 = vunpckhps_avx(auVar71,auVar82);
        auVar71 = *(undefined1 (*) [16])(lVar6 + uVar52 * 4);
        lVar8 = *(long *)(lVar8 + lVar63);
        auVar82 = *(undefined1 (*) [16])(lVar8 + uVar54 * 4);
        auVar98 = vunpcklps_avx(auVar71,auVar82);
        auVar71 = vunpckhps_avx(auVar71,auVar82);
        auVar92 = vunpcklps_avx(auVar70,auVar71);
        auVar107 = vunpcklps_avx(auVar90,auVar98);
        auVar70 = vunpckhps_avx(auVar90,auVar98);
        auVar71 = *(undefined1 (*) [16])(lVar53 + uVar51 * 4);
        auVar82 = *(undefined1 (*) [16])(lVar7 + uVar55 * 4);
        auVar98 = vunpcklps_avx(auVar71,auVar82);
        auVar90 = vunpckhps_avx(auVar71,auVar82);
        auVar71 = *(undefined1 (*) [16])(lVar6 + uVar47 * 4);
        auVar82 = *(undefined1 (*) [16])(lVar8 + uVar59 * 4);
        auVar106 = vunpcklps_avx(auVar71,auVar82);
        auVar71 = vunpckhps_avx(auVar71,auVar82);
        auVar93 = vunpcklps_avx(auVar90,auVar71);
        auVar108 = vunpcklps_avx(auVar98,auVar106);
        auVar90 = vunpckhps_avx(auVar98,auVar106);
        auVar71 = *(undefined1 (*) [16])(lVar53 + uVar44 * 4);
        auVar82 = *(undefined1 (*) [16])(lVar7 + uVar56 * 4);
        auVar106 = vunpcklps_avx(auVar71,auVar82);
        auVar98 = vunpckhps_avx(auVar71,auVar82);
        auVar71 = *(undefined1 (*) [16])(lVar6 + uVar48 * 4);
        auVar82 = *(undefined1 (*) [16])(lVar8 + uVar58 * 4);
        auVar72 = vunpcklps_avx(auVar71,auVar82);
        auVar71 = vunpckhps_avx(auVar71,auVar82);
        auVar125 = vunpcklps_avx(auVar98,auVar71);
        auVar136 = vunpcklps_avx(auVar106,auVar72);
        auVar98 = vunpckhps_avx(auVar106,auVar72);
        auVar71 = *(undefined1 (*) [16])(lVar53 + uVar46 * 4);
        auVar82 = *(undefined1 (*) [16])(lVar7 + uVar57 * 4);
        auVar72 = vunpcklps_avx(auVar71,auVar82);
        auVar106 = vunpckhps_avx(auVar71,auVar82);
        auVar71 = *(undefined1 (*) [16])(lVar6 + uVar49 * 4);
        auVar82 = *(undefined1 (*) [16])(lVar8 + uVar61 * 4);
        auVar99 = vunpcklps_avx(auVar71,auVar82);
        auVar71 = vunpckhps_avx(auVar71,auVar82);
        auVar82 = vunpcklps_avx(auVar106,auVar71);
        auVar106 = vunpcklps_avx(auVar72,auVar99);
        auVar71 = vunpckhps_avx(auVar72,auVar99);
        fVar143 = 1.0 - fVar140;
        auVar154._4_4_ = fVar143;
        auVar154._0_4_ = fVar143;
        auVar154._8_4_ = fVar143;
        auVar154._12_4_ = fVar143;
        auVar72._0_4_ = fVar140 * auVar107._0_4_;
        auVar72._4_4_ = fVar140 * auVar107._4_4_;
        auVar72._8_4_ = fVar140 * auVar107._8_4_;
        auVar72._12_4_ = fVar140 * auVar107._12_4_;
        auVar107 = vfmadd231ps_fma(auVar72,auVar154,local_1330);
        auVar117._0_4_ = fVar140 * auVar70._0_4_;
        auVar117._4_4_ = fVar140 * auVar70._4_4_;
        auVar117._8_4_ = fVar140 * auVar70._8_4_;
        auVar117._12_4_ = fVar140 * auVar70._12_4_;
        auVar70 = vfmadd231ps_fma(auVar117,auVar154,auVar91);
        auVar99._0_4_ = auVar92._0_4_ * fVar140;
        auVar99._4_4_ = auVar92._4_4_ * fVar140;
        auVar99._8_4_ = auVar92._8_4_ * fVar140;
        auVar99._12_4_ = auVar92._12_4_ * fVar140;
        auVar91 = vfmadd231ps_fma(auVar99,auVar154,auVar65);
        auVar161._0_4_ = fVar140 * auVar108._0_4_;
        auVar161._4_4_ = fVar140 * auVar108._4_4_;
        auVar161._8_4_ = fVar140 * auVar108._8_4_;
        auVar161._12_4_ = fVar140 * auVar108._12_4_;
        auVar92 = vfmadd231ps_fma(auVar161,auVar154,auVar84);
        auVar108._0_4_ = fVar140 * auVar90._0_4_;
        auVar108._4_4_ = fVar140 * auVar90._4_4_;
        auVar108._8_4_ = fVar140 * auVar90._8_4_;
        auVar108._12_4_ = fVar140 * auVar90._12_4_;
        auVar90 = vfmadd231ps_fma(auVar108,auVar154,auVar97);
        auVar84._0_4_ = auVar93._0_4_ * fVar140;
        auVar84._4_4_ = auVar93._4_4_ * fVar140;
        auVar84._8_4_ = auVar93._8_4_ * fVar140;
        auVar84._12_4_ = auVar93._12_4_ * fVar140;
        auVar97 = vfmadd231ps_fma(auVar84,auVar154,auVar83);
        auVar93._0_4_ = fVar140 * auVar136._0_4_;
        auVar93._4_4_ = fVar140 * auVar136._4_4_;
        auVar93._8_4_ = fVar140 * auVar136._8_4_;
        auVar93._12_4_ = fVar140 * auVar136._12_4_;
        auVar83 = vfmadd231ps_fma(auVar93,auVar154,auVar121);
        auVar136._0_4_ = auVar98._0_4_ * fVar140;
        auVar136._4_4_ = auVar98._4_4_ * fVar140;
        auVar136._8_4_ = auVar98._8_4_ * fVar140;
        auVar136._12_4_ = auVar98._12_4_ * fVar140;
        auVar98 = vfmadd231ps_fma(auVar136,auVar154,local_1380);
        auVar141._0_4_ = auVar125._0_4_ * fVar140;
        auVar141._4_4_ = auVar125._4_4_ * fVar140;
        auVar141._8_4_ = auVar125._8_4_ * fVar140;
        auVar141._12_4_ = auVar125._12_4_ * fVar140;
        auVar93 = vfmadd231ps_fma(auVar141,auVar154,local_1340);
        auVar121._0_4_ = fVar140 * auVar106._0_4_;
        auVar121._4_4_ = fVar140 * auVar106._4_4_;
        auVar121._8_4_ = fVar140 * auVar106._8_4_;
        auVar121._12_4_ = fVar140 * auVar106._12_4_;
        auVar125._0_4_ = auVar71._0_4_ * fVar140;
        auVar125._4_4_ = auVar71._4_4_ * fVar140;
        auVar125._8_4_ = auVar71._8_4_ * fVar140;
        auVar125._12_4_ = auVar71._12_4_ * fVar140;
        lVar6 = uVar62 + 0x40 + lVar40;
        local_10e0 = *(undefined8 *)(lVar6 + 0x10);
        uStack_10d8 = *(undefined8 *)(lVar6 + 0x18);
        auVar65._0_4_ = auVar82._0_4_ * fVar140;
        auVar65._4_4_ = auVar82._4_4_ * fVar140;
        auVar65._8_4_ = auVar82._8_4_ * fVar140;
        auVar65._12_4_ = auVar82._12_4_ * fVar140;
        uStack_10d0 = local_10e0;
        uStack_10c8 = uStack_10d8;
        lVar40 = uVar62 + 0x50 + lVar40;
        local_1320 = *(undefined8 *)(lVar40 + 0x10);
        uStack_1318 = *(undefined8 *)(lVar40 + 0x18);
        auVar71 = vfmadd231ps_fma(auVar121,auVar154,local_1360);
        auVar82 = vfmadd231ps_fma(auVar125,auVar154,local_1370);
        auVar106 = vfmadd231ps_fma(auVar65,auVar154,local_1350);
        uStack_1310 = local_1320;
        uStack_1308 = uStack_1318;
        auVar75._16_16_ = auVar83;
        auVar75._0_16_ = auVar107;
        auVar94._16_16_ = auVar98;
        auVar94._0_16_ = auVar70;
        auVar100._16_16_ = auVar93;
        auVar100._0_16_ = auVar91;
        auVar137._16_16_ = auVar92;
        auVar137._0_16_ = auVar92;
        auVar109._16_16_ = auVar90;
        auVar109._0_16_ = auVar90;
        auVar85._16_16_ = auVar97;
        auVar85._0_16_ = auVar97;
        auVar162._16_16_ = auVar71;
        auVar162._0_16_ = auVar71;
        auVar126._16_16_ = auVar82;
        auVar126._0_16_ = auVar82;
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar147._4_4_ = uVar1;
        auVar147._0_4_ = uVar1;
        auVar147._8_4_ = uVar1;
        auVar147._12_4_ = uVar1;
        auVar147._16_4_ = uVar1;
        auVar147._20_4_ = uVar1;
        auVar147._24_4_ = uVar1;
        auVar147._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar150._4_4_ = uVar1;
        auVar150._0_4_ = uVar1;
        auVar150._8_4_ = uVar1;
        auVar150._12_4_ = uVar1;
        auVar150._16_4_ = uVar1;
        auVar150._20_4_ = uVar1;
        auVar150._24_4_ = uVar1;
        auVar150._28_4_ = uVar1;
        auVar66._16_16_ = auVar106;
        auVar66._0_16_ = auVar106;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar155._4_4_ = uVar2;
        auVar155._0_4_ = uVar2;
        auVar155._8_4_ = uVar2;
        auVar155._12_4_ = uVar2;
        auVar155._16_4_ = uVar2;
        auVar155._20_4_ = uVar2;
        auVar155._24_4_ = uVar2;
        auVar155._28_4_ = uVar2;
        local_1460 = vsubps_avx(auVar75,auVar147);
        local_1480 = vsubps_avx(auVar94,auVar150);
        local_14a0 = vsubps_avx(auVar100,auVar155);
        auVar73 = vsubps_avx(auVar137,auVar147);
        auVar74 = vsubps_avx(auVar109,auVar150);
        auVar79 = vsubps_avx(auVar85,auVar155);
        auVar75 = vsubps_avx(auVar162,auVar147);
        auVar85 = vsubps_avx(auVar126,auVar150);
        auVar14 = vsubps_avx(auVar66,auVar155);
        local_14c0 = vsubps_avx(auVar75,local_1460);
        local_1500 = vsubps_avx(auVar85,local_1480);
        local_14e0 = vsubps_avx(auVar14,local_14a0);
        auVar67._0_4_ = local_1460._0_4_ + auVar75._0_4_;
        auVar67._4_4_ = local_1460._4_4_ + auVar75._4_4_;
        auVar67._8_4_ = local_1460._8_4_ + auVar75._8_4_;
        auVar67._12_4_ = local_1460._12_4_ + auVar75._12_4_;
        auVar67._16_4_ = local_1460._16_4_ + auVar75._16_4_;
        auVar67._20_4_ = local_1460._20_4_ + auVar75._20_4_;
        auVar67._24_4_ = local_1460._24_4_ + auVar75._24_4_;
        auVar67._28_4_ = local_1460._28_4_ + auVar75._28_4_;
        auVar86._0_4_ = auVar85._0_4_ + local_1480._0_4_;
        auVar86._4_4_ = auVar85._4_4_ + local_1480._4_4_;
        auVar86._8_4_ = auVar85._8_4_ + local_1480._8_4_;
        auVar86._12_4_ = auVar85._12_4_ + local_1480._12_4_;
        auVar86._16_4_ = auVar85._16_4_ + local_1480._16_4_;
        auVar86._20_4_ = auVar85._20_4_ + local_1480._20_4_;
        auVar86._24_4_ = auVar85._24_4_ + local_1480._24_4_;
        fVar105 = local_1480._28_4_;
        auVar86._28_4_ = auVar85._28_4_ + fVar105;
        fVar140 = local_14a0._0_4_;
        auVar101._0_4_ = auVar14._0_4_ + fVar140;
        fVar143 = local_14a0._4_4_;
        auVar101._4_4_ = auVar14._4_4_ + fVar143;
        fVar144 = local_14a0._8_4_;
        auVar101._8_4_ = auVar14._8_4_ + fVar144;
        fVar145 = local_14a0._12_4_;
        auVar101._12_4_ = auVar14._12_4_ + fVar145;
        fVar146 = local_14a0._16_4_;
        auVar101._16_4_ = auVar14._16_4_ + fVar146;
        fVar148 = local_14a0._20_4_;
        auVar101._20_4_ = auVar14._20_4_ + fVar148;
        fVar149 = local_14a0._24_4_;
        auVar101._24_4_ = auVar14._24_4_ + fVar149;
        auVar101._28_4_ = auVar14._28_4_ + local_14a0._28_4_;
        auVar15._4_4_ = local_14e0._4_4_ * auVar86._4_4_;
        auVar15._0_4_ = local_14e0._0_4_ * auVar86._0_4_;
        auVar15._8_4_ = local_14e0._8_4_ * auVar86._8_4_;
        auVar15._12_4_ = local_14e0._12_4_ * auVar86._12_4_;
        auVar15._16_4_ = local_14e0._16_4_ * auVar86._16_4_;
        auVar15._20_4_ = local_14e0._20_4_ * auVar86._20_4_;
        auVar15._24_4_ = local_14e0._24_4_ * auVar86._24_4_;
        auVar15._28_4_ = uVar1;
        auVar82 = vfmsub231ps_fma(auVar15,local_1500,auVar101);
        auVar16._4_4_ = local_14c0._4_4_ * auVar101._4_4_;
        auVar16._0_4_ = local_14c0._0_4_ * auVar101._0_4_;
        auVar16._8_4_ = local_14c0._8_4_ * auVar101._8_4_;
        auVar16._12_4_ = local_14c0._12_4_ * auVar101._12_4_;
        auVar16._16_4_ = local_14c0._16_4_ * auVar101._16_4_;
        auVar16._20_4_ = local_14c0._20_4_ * auVar101._20_4_;
        auVar16._24_4_ = local_14c0._24_4_ * auVar101._24_4_;
        auVar16._28_4_ = auVar101._28_4_;
        auVar71 = vfmsub231ps_fma(auVar16,local_14e0,auVar67);
        auVar18._4_4_ = local_1500._4_4_ * auVar67._4_4_;
        auVar18._0_4_ = local_1500._0_4_ * auVar67._0_4_;
        auVar18._8_4_ = local_1500._8_4_ * auVar67._8_4_;
        auVar18._12_4_ = local_1500._12_4_ * auVar67._12_4_;
        auVar18._16_4_ = local_1500._16_4_ * auVar67._16_4_;
        auVar18._20_4_ = local_1500._20_4_ * auVar67._20_4_;
        auVar18._24_4_ = local_1500._24_4_ * auVar67._24_4_;
        auVar18._28_4_ = auVar67._28_4_;
        auVar70 = vfmsub231ps_fma(auVar18,local_14c0,auVar86);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0xa0);
        auVar156._4_4_ = uVar1;
        auVar156._0_4_ = uVar1;
        auVar156._8_4_ = uVar1;
        auVar156._12_4_ = uVar1;
        auVar156._16_4_ = uVar1;
        auVar156._20_4_ = uVar1;
        auVar156._24_4_ = uVar1;
        auVar156._28_4_ = uVar1;
        fStack_1510 = *(float *)(ray + k * 4 + 0xc0);
        auVar19._4_4_ = fStack_1510 * auVar70._4_4_;
        auVar19._0_4_ = fStack_1510 * auVar70._0_4_;
        auVar19._8_4_ = fStack_1510 * auVar70._8_4_;
        auVar19._12_4_ = fStack_1510 * auVar70._12_4_;
        auVar19._16_4_ = fStack_1510 * 0.0;
        auVar19._20_4_ = fStack_1510 * 0.0;
        auVar19._24_4_ = fStack_1510 * 0.0;
        auVar19._28_4_ = local_14e0._28_4_;
        auVar71 = vfmadd231ps_fma(auVar19,auVar156,ZEXT1632(auVar71));
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar122._4_4_ = uVar1;
        auVar122._0_4_ = uVar1;
        auVar122._8_4_ = uVar1;
        auVar122._12_4_ = uVar1;
        auVar122._16_4_ = uVar1;
        auVar122._20_4_ = uVar1;
        auVar122._24_4_ = uVar1;
        auVar122._28_4_ = uVar1;
        local_1300 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar122,ZEXT1632(auVar82));
        local_1540 = vsubps_avx(local_1480,auVar74);
        local_1560 = vsubps_avx(local_14a0,auVar79);
        auVar87._0_4_ = auVar74._0_4_ + local_1480._0_4_;
        auVar87._4_4_ = auVar74._4_4_ + local_1480._4_4_;
        auVar87._8_4_ = auVar74._8_4_ + local_1480._8_4_;
        auVar87._12_4_ = auVar74._12_4_ + local_1480._12_4_;
        auVar87._16_4_ = auVar74._16_4_ + local_1480._16_4_;
        auVar87._20_4_ = auVar74._20_4_ + local_1480._20_4_;
        auVar87._24_4_ = auVar74._24_4_ + local_1480._24_4_;
        auVar87._28_4_ = auVar74._28_4_ + fVar105;
        auVar102._0_4_ = fVar140 + auVar79._0_4_;
        auVar102._4_4_ = fVar143 + auVar79._4_4_;
        auVar102._8_4_ = fVar144 + auVar79._8_4_;
        auVar102._12_4_ = fVar145 + auVar79._12_4_;
        auVar102._16_4_ = fVar146 + auVar79._16_4_;
        auVar102._20_4_ = fVar148 + auVar79._20_4_;
        auVar102._24_4_ = fVar149 + auVar79._24_4_;
        auVar102._28_4_ = local_14a0._28_4_ + auVar79._28_4_;
        fVar111 = local_1560._0_4_;
        fVar113 = local_1560._4_4_;
        auVar20._4_4_ = auVar87._4_4_ * fVar113;
        auVar20._0_4_ = auVar87._0_4_ * fVar111;
        fVar116 = local_1560._8_4_;
        auVar20._8_4_ = auVar87._8_4_ * fVar116;
        fVar153 = local_1560._12_4_;
        auVar20._12_4_ = auVar87._12_4_ * fVar153;
        fVar159 = local_1560._16_4_;
        auVar20._16_4_ = auVar87._16_4_ * fVar159;
        fVar164 = local_1560._20_4_;
        auVar20._20_4_ = auVar87._20_4_ * fVar164;
        fVar11 = local_1560._24_4_;
        auVar20._24_4_ = auVar87._24_4_ * fVar11;
        auVar20._28_4_ = fVar105;
        auVar82 = vfmsub231ps_fma(auVar20,local_1540,auVar102);
        auVar15 = vsubps_avx(local_1460,auVar73);
        fVar105 = auVar15._0_4_;
        fVar114 = auVar15._4_4_;
        auVar21._4_4_ = auVar102._4_4_ * fVar114;
        auVar21._0_4_ = auVar102._0_4_ * fVar105;
        fVar151 = auVar15._8_4_;
        auVar21._8_4_ = auVar102._8_4_ * fVar151;
        fVar157 = auVar15._12_4_;
        auVar21._12_4_ = auVar102._12_4_ * fVar157;
        fVar160 = auVar15._16_4_;
        auVar21._16_4_ = auVar102._16_4_ * fVar160;
        fVar165 = auVar15._20_4_;
        auVar21._20_4_ = auVar102._20_4_ * fVar165;
        fVar12 = auVar15._24_4_;
        auVar21._24_4_ = auVar102._24_4_ * fVar12;
        auVar21._28_4_ = auVar102._28_4_;
        auVar127._0_4_ = local_1460._0_4_ + auVar73._0_4_;
        auVar127._4_4_ = local_1460._4_4_ + auVar73._4_4_;
        auVar127._8_4_ = local_1460._8_4_ + auVar73._8_4_;
        auVar127._12_4_ = local_1460._12_4_ + auVar73._12_4_;
        auVar127._16_4_ = local_1460._16_4_ + auVar73._16_4_;
        auVar127._20_4_ = local_1460._20_4_ + auVar73._20_4_;
        auVar127._24_4_ = local_1460._24_4_ + auVar73._24_4_;
        auVar127._28_4_ = local_1460._28_4_ + auVar73._28_4_;
        auVar71 = vfmsub231ps_fma(auVar21,local_1560,auVar127);
        fVar112 = local_1540._0_4_;
        fVar115 = local_1540._4_4_;
        auVar22._4_4_ = auVar127._4_4_ * fVar115;
        auVar22._0_4_ = auVar127._0_4_ * fVar112;
        fVar152 = local_1540._8_4_;
        auVar22._8_4_ = auVar127._8_4_ * fVar152;
        fVar158 = local_1540._12_4_;
        auVar22._12_4_ = auVar127._12_4_ * fVar158;
        fVar163 = local_1540._16_4_;
        auVar22._16_4_ = auVar127._16_4_ * fVar163;
        fVar10 = local_1540._20_4_;
        auVar22._20_4_ = auVar127._20_4_ * fVar10;
        fVar13 = local_1540._24_4_;
        auVar22._24_4_ = auVar127._24_4_ * fVar13;
        auVar22._28_4_ = auVar127._28_4_;
        auVar70 = vfmsub231ps_fma(auVar22,auVar15,auVar87);
        auVar23._4_4_ = auVar70._4_4_ * fStack_1510;
        auVar23._0_4_ = auVar70._0_4_ * fStack_1510;
        auVar23._8_4_ = auVar70._8_4_ * fStack_1510;
        auVar23._12_4_ = auVar70._12_4_ * fStack_1510;
        auVar23._16_4_ = fStack_1510 * 0.0;
        auVar23._20_4_ = fStack_1510 * 0.0;
        auVar23._24_4_ = fStack_1510 * 0.0;
        auVar23._28_4_ = auVar87._28_4_;
        auVar71 = vfmadd231ps_fma(auVar23,auVar156,ZEXT1632(auVar71));
        auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar122,ZEXT1632(auVar82));
        auVar16 = vsubps_avx(auVar73,auVar75);
        auVar95._0_4_ = auVar73._0_4_ + auVar75._0_4_;
        auVar95._4_4_ = auVar73._4_4_ + auVar75._4_4_;
        auVar95._8_4_ = auVar73._8_4_ + auVar75._8_4_;
        auVar95._12_4_ = auVar73._12_4_ + auVar75._12_4_;
        auVar95._16_4_ = auVar73._16_4_ + auVar75._16_4_;
        auVar95._20_4_ = auVar73._20_4_ + auVar75._20_4_;
        auVar95._24_4_ = auVar73._24_4_ + auVar75._24_4_;
        auVar95._28_4_ = auVar73._28_4_ + auVar75._28_4_;
        auVar75 = vsubps_avx(auVar74,auVar85);
        auVar110._0_4_ = auVar74._0_4_ + auVar85._0_4_;
        auVar110._4_4_ = auVar74._4_4_ + auVar85._4_4_;
        auVar110._8_4_ = auVar74._8_4_ + auVar85._8_4_;
        auVar110._12_4_ = auVar74._12_4_ + auVar85._12_4_;
        auVar110._16_4_ = auVar74._16_4_ + auVar85._16_4_;
        auVar110._20_4_ = auVar74._20_4_ + auVar85._20_4_;
        auVar110._24_4_ = auVar74._24_4_ + auVar85._24_4_;
        auVar110._28_4_ = auVar74._28_4_ + auVar85._28_4_;
        auVar85 = vsubps_avx(auVar79,auVar14);
        auVar76._0_4_ = auVar79._0_4_ + auVar14._0_4_;
        auVar76._4_4_ = auVar79._4_4_ + auVar14._4_4_;
        auVar76._8_4_ = auVar79._8_4_ + auVar14._8_4_;
        auVar76._12_4_ = auVar79._12_4_ + auVar14._12_4_;
        auVar76._16_4_ = auVar79._16_4_ + auVar14._16_4_;
        auVar76._20_4_ = auVar79._20_4_ + auVar14._20_4_;
        auVar76._24_4_ = auVar79._24_4_ + auVar14._24_4_;
        auVar76._28_4_ = auVar79._28_4_ + auVar14._28_4_;
        auVar118._0_4_ = auVar85._0_4_ * auVar110._0_4_;
        auVar118._4_4_ = auVar85._4_4_ * auVar110._4_4_;
        auVar118._8_4_ = auVar85._8_4_ * auVar110._8_4_;
        auVar118._12_4_ = auVar85._12_4_ * auVar110._12_4_;
        auVar118._16_4_ = auVar85._16_4_ * auVar110._16_4_;
        auVar118._20_4_ = auVar85._20_4_ * auVar110._20_4_;
        auVar118._24_4_ = auVar85._24_4_ * auVar110._24_4_;
        auVar118._28_4_ = 0;
        auVar70 = vfmsub231ps_fma(auVar118,auVar75,auVar76);
        auVar14._4_4_ = auVar76._4_4_ * auVar16._4_4_;
        auVar14._0_4_ = auVar76._0_4_ * auVar16._0_4_;
        auVar14._8_4_ = auVar76._8_4_ * auVar16._8_4_;
        auVar14._12_4_ = auVar76._12_4_ * auVar16._12_4_;
        auVar14._16_4_ = auVar76._16_4_ * auVar16._16_4_;
        auVar14._20_4_ = auVar76._20_4_ * auVar16._20_4_;
        auVar14._24_4_ = auVar76._24_4_ * auVar16._24_4_;
        auVar14._28_4_ = auVar76._28_4_;
        auVar82 = vfmsub231ps_fma(auVar14,auVar85,auVar95);
        auVar24._4_4_ = auVar75._4_4_ * auVar95._4_4_;
        auVar24._0_4_ = auVar75._0_4_ * auVar95._0_4_;
        auVar24._8_4_ = auVar75._8_4_ * auVar95._8_4_;
        auVar24._12_4_ = auVar75._12_4_ * auVar95._12_4_;
        auVar24._16_4_ = auVar75._16_4_ * auVar95._16_4_;
        auVar24._20_4_ = auVar75._20_4_ * auVar95._20_4_;
        auVar24._24_4_ = auVar75._24_4_ * auVar95._24_4_;
        auVar24._28_4_ = auVar95._28_4_;
        auVar90 = vfmsub231ps_fma(auVar24,auVar16,auVar110);
        fStack_151c = fStack_1510;
        local_1520 = fStack_1510;
        fStack_1518 = fStack_1510;
        fStack_1514 = fStack_1510;
        auVar96._0_4_ = fStack_1510 * auVar90._0_4_;
        auVar96._4_4_ = fStack_1510 * auVar90._4_4_;
        auVar96._8_4_ = fStack_1510 * auVar90._8_4_;
        auVar96._12_4_ = fStack_1510 * auVar90._12_4_;
        auVar96._16_4_ = fStack_1510 * 0.0;
        auVar96._20_4_ = fStack_1510 * 0.0;
        auVar96._24_4_ = fStack_1510 * 0.0;
        auVar96._28_4_ = 0;
        auVar82 = vfmadd231ps_fma(auVar96,auVar156,ZEXT1632(auVar82));
        auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar122,ZEXT1632(auVar70));
        local_12c0 = ZEXT1632(CONCAT412(auVar82._12_4_ + local_1300._12_4_ + auVar71._12_4_,
                                        CONCAT48(auVar82._8_4_ + local_1300._8_4_ + auVar71._8_4_,
                                                 CONCAT44(auVar82._4_4_ +
                                                          local_1300._4_4_ + auVar71._4_4_,
                                                          auVar82._0_4_ +
                                                          local_1300._0_4_ + auVar71._0_4_))));
        auVar77._8_4_ = 0x7fffffff;
        auVar77._0_8_ = 0x7fffffff7fffffff;
        auVar77._12_4_ = 0x7fffffff;
        auVar77._16_4_ = 0x7fffffff;
        auVar77._20_4_ = 0x7fffffff;
        auVar77._24_4_ = 0x7fffffff;
        auVar77._28_4_ = 0x7fffffff;
        local_1580 = ZEXT1632(local_1300);
        auVar73 = vminps_avx(local_1580,ZEXT1632(auVar71));
        auVar73 = vminps_avx(auVar73,ZEXT1632(auVar82));
        local_15a0 = vandps_avx(local_12c0,auVar77);
        fVar124 = local_15a0._0_4_ * 1.1920929e-07;
        fVar130 = local_15a0._4_4_ * 1.1920929e-07;
        auVar25._4_4_ = fVar130;
        auVar25._0_4_ = fVar124;
        fVar131 = local_15a0._8_4_ * 1.1920929e-07;
        auVar25._8_4_ = fVar131;
        fVar132 = local_15a0._12_4_ * 1.1920929e-07;
        auVar25._12_4_ = fVar132;
        fVar133 = local_15a0._16_4_ * 1.1920929e-07;
        auVar25._16_4_ = fVar133;
        fVar134 = local_15a0._20_4_ * 1.1920929e-07;
        auVar25._20_4_ = fVar134;
        fVar135 = local_15a0._24_4_ * 1.1920929e-07;
        auVar25._24_4_ = fVar135;
        auVar25._28_4_ = 0x34000000;
        auVar119._0_8_ = CONCAT44(fVar130,fVar124) ^ 0x8000000080000000;
        auVar119._8_4_ = -fVar131;
        auVar119._12_4_ = -fVar132;
        auVar119._16_4_ = -fVar133;
        auVar119._20_4_ = -fVar134;
        auVar119._24_4_ = -fVar135;
        auVar119._28_4_ = 0xb4000000;
        auVar73 = vcmpps_avx(auVar73,auVar119,5);
        auVar79 = vmaxps_avx(local_1580,ZEXT1632(auVar71));
        auVar74 = vmaxps_avx(auVar79,ZEXT1632(auVar82));
        auVar74 = vcmpps_avx(auVar74,auVar25,2);
        auVar74 = vorps_avx(auVar73,auVar74);
        if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar74 >> 0x7f,0) != '\0') ||
              (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar74 >> 0xbf,0) != '\0') ||
            (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar74[0x1f] < '\0') {
          auVar26._4_4_ = local_14e0._4_4_ * fVar115;
          auVar26._0_4_ = local_14e0._0_4_ * fVar112;
          auVar26._8_4_ = local_14e0._8_4_ * fVar152;
          auVar26._12_4_ = local_14e0._12_4_ * fVar158;
          auVar26._16_4_ = local_14e0._16_4_ * fVar163;
          auVar26._20_4_ = local_14e0._20_4_ * fVar10;
          auVar26._24_4_ = local_14e0._24_4_ * fVar13;
          auVar26._28_4_ = auVar73._28_4_;
          auVar27._4_4_ = fVar114 * local_1500._4_4_;
          auVar27._0_4_ = fVar105 * local_1500._0_4_;
          auVar27._8_4_ = fVar151 * local_1500._8_4_;
          auVar27._12_4_ = fVar157 * local_1500._12_4_;
          auVar27._16_4_ = fVar160 * local_1500._16_4_;
          auVar27._20_4_ = fVar165 * local_1500._20_4_;
          auVar27._24_4_ = fVar12 * local_1500._24_4_;
          auVar27._28_4_ = 0x34000000;
          auVar82 = vfmsub213ps_fma(local_1500,local_1560,auVar26);
          auVar28._4_4_ = auVar75._4_4_ * fVar113;
          auVar28._0_4_ = auVar75._0_4_ * fVar111;
          auVar28._8_4_ = auVar75._8_4_ * fVar116;
          auVar28._12_4_ = auVar75._12_4_ * fVar153;
          auVar28._16_4_ = auVar75._16_4_ * fVar159;
          auVar28._20_4_ = auVar75._20_4_ * fVar164;
          auVar28._24_4_ = auVar75._24_4_ * fVar11;
          auVar28._28_4_ = auVar79._28_4_;
          auVar29._4_4_ = fVar114 * auVar85._4_4_;
          auVar29._0_4_ = fVar105 * auVar85._0_4_;
          auVar29._8_4_ = fVar151 * auVar85._8_4_;
          auVar29._12_4_ = fVar157 * auVar85._12_4_;
          auVar29._16_4_ = fVar160 * auVar85._16_4_;
          auVar29._20_4_ = fVar165 * auVar85._20_4_;
          auVar29._24_4_ = fVar12 * auVar85._24_4_;
          auVar29._28_4_ = local_15a0._28_4_;
          auVar70 = vfmsub213ps_fma(auVar85,local_1540,auVar28);
          auVar73 = vandps_avx(auVar26,auVar77);
          auVar79 = vandps_avx(auVar28,auVar77);
          auVar73 = vcmpps_avx(auVar73,auVar79,1);
          local_12a0 = vblendvps_avx(ZEXT1632(auVar70),ZEXT1632(auVar82),auVar73);
          auVar30._4_4_ = auVar16._4_4_ * fVar115;
          auVar30._0_4_ = auVar16._0_4_ * fVar112;
          auVar30._8_4_ = auVar16._8_4_ * fVar152;
          auVar30._12_4_ = auVar16._12_4_ * fVar158;
          auVar30._16_4_ = auVar16._16_4_ * fVar163;
          auVar30._20_4_ = auVar16._20_4_ * fVar10;
          auVar30._24_4_ = auVar16._24_4_ * fVar13;
          auVar30._28_4_ = auVar73._28_4_;
          auVar82 = vfmsub213ps_fma(auVar16,local_1560,auVar29);
          auVar31._4_4_ = local_14c0._4_4_ * fVar113;
          auVar31._0_4_ = local_14c0._0_4_ * fVar111;
          auVar31._8_4_ = local_14c0._8_4_ * fVar116;
          auVar31._12_4_ = local_14c0._12_4_ * fVar153;
          auVar31._16_4_ = local_14c0._16_4_ * fVar159;
          auVar31._20_4_ = local_14c0._20_4_ * fVar164;
          auVar31._24_4_ = local_14c0._24_4_ * fVar11;
          auVar31._28_4_ = auVar79._28_4_;
          auVar70 = vfmsub213ps_fma(local_14e0,auVar15,auVar31);
          auVar73 = vandps_avx(auVar31,auVar77);
          auVar79 = vandps_avx(auVar29,auVar77);
          auVar73 = vcmpps_avx(auVar73,auVar79,1);
          local_1280 = vblendvps_avx(ZEXT1632(auVar82),ZEXT1632(auVar70),auVar73);
          auVar82 = vfmsub213ps_fma(local_14c0,local_1540,auVar27);
          auVar70 = vfmsub213ps_fma(auVar75,auVar15,auVar30);
          auVar73 = vandps_avx(auVar27,auVar77);
          auVar79 = vandps_avx(auVar30,auVar77);
          auVar79 = vcmpps_avx(auVar73,auVar79,1);
          local_1260 = vblendvps_avx(ZEXT1632(auVar70),ZEXT1632(auVar82),auVar79);
          auVar82 = vpackssdw_avx(auVar74._0_16_,auVar74._16_16_);
          fVar105 = local_1260._0_4_;
          auVar78._0_4_ = fVar105 * fStack_1510;
          fVar111 = local_1260._4_4_;
          auVar78._4_4_ = fVar111 * fStack_1510;
          fVar112 = local_1260._8_4_;
          auVar78._8_4_ = fVar112 * fStack_1510;
          fVar113 = local_1260._12_4_;
          auVar78._12_4_ = fVar113 * fStack_1510;
          fVar114 = local_1260._16_4_;
          auVar78._16_4_ = fVar114 * fStack_1510;
          fVar115 = local_1260._20_4_;
          auVar78._20_4_ = fVar115 * fStack_1510;
          fVar116 = local_1260._24_4_;
          auVar78._24_4_ = fVar116 * fStack_1510;
          auVar78._28_4_ = 0;
          auVar70 = vfmadd213ps_fma(auVar156,local_1280,auVar78);
          auVar70 = vfmadd213ps_fma(auVar122,local_12a0,ZEXT1632(auVar70));
          auVar79 = ZEXT1632(CONCAT412(auVar70._12_4_ + auVar70._12_4_,
                                       CONCAT48(auVar70._8_4_ + auVar70._8_4_,
                                                CONCAT44(auVar70._4_4_ + auVar70._4_4_,
                                                         auVar70._0_4_ + auVar70._0_4_))));
          auVar32._4_4_ = fVar111 * fVar143;
          auVar32._0_4_ = fVar105 * fVar140;
          auVar32._8_4_ = fVar112 * fVar144;
          auVar32._12_4_ = fVar113 * fVar145;
          auVar32._16_4_ = fVar114 * fVar146;
          auVar32._20_4_ = fVar115 * fVar148;
          auVar32._24_4_ = fVar116 * fVar149;
          auVar32._28_4_ = auVar73._28_4_;
          auVar70 = vfmadd213ps_fma(local_1480,local_1280,auVar32);
          auVar90 = vfmadd213ps_fma(local_1460,local_12a0,ZEXT1632(auVar70));
          auVar73 = vrcpps_avx(auVar79);
          auVar142._8_4_ = 0x3f800000;
          auVar142._0_8_ = &DAT_3f8000003f800000;
          auVar142._12_4_ = 0x3f800000;
          auVar142._16_4_ = 0x3f800000;
          auVar142._20_4_ = 0x3f800000;
          auVar142._24_4_ = 0x3f800000;
          auVar142._28_4_ = 0x3f800000;
          auVar70 = vfnmadd213ps_fma(auVar73,auVar79,auVar142);
          auVar70 = vfmadd132ps_fma(ZEXT1632(auVar70),auVar73,auVar73);
          local_11e0._28_4_ = 0x3f800000;
          local_11e0._0_28_ =
               ZEXT1628(CONCAT412(auVar70._12_4_ * (auVar90._12_4_ + auVar90._12_4_),
                                  CONCAT48(auVar70._8_4_ * (auVar90._8_4_ + auVar90._8_4_),
                                           CONCAT44(auVar70._4_4_ * (auVar90._4_4_ + auVar90._4_4_),
                                                    auVar70._0_4_ * (auVar90._0_4_ + auVar90._0_4_))
                                          )));
          auVar69 = ZEXT3264(local_11e0);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
          auVar103._4_4_ = uVar1;
          auVar103._0_4_ = uVar1;
          auVar103._8_4_ = uVar1;
          auVar103._12_4_ = uVar1;
          auVar103._16_4_ = uVar1;
          auVar103._20_4_ = uVar1;
          auVar103._24_4_ = uVar1;
          auVar103._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar128._4_4_ = uVar1;
          auVar128._0_4_ = uVar1;
          auVar128._8_4_ = uVar1;
          auVar128._12_4_ = uVar1;
          auVar128._16_4_ = uVar1;
          auVar128._20_4_ = uVar1;
          auVar128._24_4_ = uVar1;
          auVar128._28_4_ = uVar1;
          auVar73 = vcmpps_avx(auVar103,local_11e0,2);
          auVar74 = vcmpps_avx(local_11e0,auVar128,2);
          auVar73 = vandps_avx(auVar74,auVar73);
          auVar70 = vpackssdw_avx(auVar73._0_16_,auVar73._16_16_);
          auVar82 = vpand_avx(auVar70,auVar82);
          auVar73 = vpmovsxwd_avx2(auVar82);
          if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar73 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar73 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar73 >> 0x7f,0) != '\0') ||
                (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar73 >> 0xbf,0) != '\0') ||
              (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar73[0x1f] < '\0') {
            auVar73 = vcmpps_avx(auVar79,_DAT_02020f00,4);
            auVar70 = vpackssdw_avx(auVar73._0_16_,auVar73._16_16_);
            auVar82 = vpand_avx(auVar82,auVar70);
            local_15e0 = vpmovsxwd_avx2(auVar82);
            if ((((((((local_15e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_15e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_15e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_15e0 >> 0x7f,0) != '\0') ||
                  (local_15e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(local_15e0 >> 0xbf,0) != '\0') ||
                (local_15e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                local_15e0[0x1f] < '\0') {
              uStack_12f0 = 0;
              uStack_12ec = 0;
              uStack_12e8 = 0;
              uStack_12e4 = 0;
              local_12e0 = ZEXT1632(auVar71);
              local_1240 = local_15e0;
              local_1160 = local_1100;
              auVar73 = vrcpps_avx(local_12c0);
              auVar138._8_4_ = 0x3f800000;
              auVar138._0_8_ = &DAT_3f8000003f800000;
              auVar138._12_4_ = 0x3f800000;
              auVar138._16_4_ = 0x3f800000;
              auVar138._20_4_ = 0x3f800000;
              auVar138._24_4_ = 0x3f800000;
              auVar138._28_4_ = 0x3f800000;
              auVar70 = vfnmadd213ps_fma(local_12c0,auVar73,auVar138);
              auVar70 = vfmadd132ps_fma(ZEXT1632(auVar70),auVar73,auVar73);
              auVar104._8_4_ = 0x219392ef;
              auVar104._0_8_ = 0x219392ef219392ef;
              auVar104._12_4_ = 0x219392ef;
              auVar104._16_4_ = 0x219392ef;
              auVar104._20_4_ = 0x219392ef;
              auVar104._24_4_ = 0x219392ef;
              auVar104._28_4_ = 0x219392ef;
              auVar73 = vcmpps_avx(local_15a0,auVar104,5);
              auVar73 = vandps_avx(auVar73,ZEXT1632(auVar70));
              auVar33._4_4_ = local_1300._4_4_ * auVar73._4_4_;
              auVar33._0_4_ = local_1300._0_4_ * auVar73._0_4_;
              auVar33._8_4_ = local_1300._8_4_ * auVar73._8_4_;
              auVar33._12_4_ = local_1300._12_4_ * auVar73._12_4_;
              auVar33._16_4_ = auVar73._16_4_ * 0.0;
              auVar33._20_4_ = auVar73._20_4_ * 0.0;
              auVar33._24_4_ = auVar73._24_4_ * 0.0;
              auVar33._28_4_ = 0;
              auVar74 = vminps_avx(auVar33,auVar138);
              auVar88._0_4_ = auVar71._0_4_ * auVar73._0_4_;
              auVar88._4_4_ = auVar71._4_4_ * auVar73._4_4_;
              auVar88._8_4_ = auVar71._8_4_ * auVar73._8_4_;
              auVar88._12_4_ = auVar71._12_4_ * auVar73._12_4_;
              auVar88._16_4_ = auVar73._16_4_ * 0.0;
              auVar88._20_4_ = auVar73._20_4_ * 0.0;
              auVar88._24_4_ = auVar73._24_4_ * 0.0;
              auVar88._28_4_ = 0;
              auVar73 = vminps_avx(auVar88,auVar138);
              auVar79 = vsubps_avx(auVar138,auVar74);
              auVar75 = vsubps_avx(auVar138,auVar73);
              local_1200 = vblendvps_avx(auVar73,auVar79,local_1100);
              local_1220 = vblendvps_avx(auVar74,auVar75,local_1100);
              local_11c0[0] = local_12a0._0_4_ * (float)local_1120._0_4_;
              local_11c0[1] = local_12a0._4_4_ * (float)local_1120._4_4_;
              local_11c0[2] = local_12a0._8_4_ * fStack_1118;
              local_11c0[3] = local_12a0._12_4_ * fStack_1114;
              fStack_11b0 = local_12a0._16_4_ * fStack_1110;
              fStack_11ac = local_12a0._20_4_ * fStack_110c;
              fStack_11a8 = local_12a0._24_4_ * fStack_1108;
              uStack_11a4 = local_1220._28_4_;
              local_11a0[0] = (float)local_1120._0_4_ * local_1280._0_4_;
              local_11a0[1] = (float)local_1120._4_4_ * local_1280._4_4_;
              local_11a0[2] = fStack_1118 * local_1280._8_4_;
              local_11a0[3] = fStack_1114 * local_1280._12_4_;
              fStack_1190 = fStack_1110 * local_1280._16_4_;
              fStack_118c = fStack_110c * local_1280._20_4_;
              fStack_1188 = fStack_1108 * local_1280._24_4_;
              uStack_1184 = local_1200._28_4_;
              local_1180[0] = (float)local_1120._0_4_ * fVar105;
              local_1180[1] = (float)local_1120._4_4_ * fVar111;
              local_1180[2] = fStack_1118 * fVar112;
              local_1180[3] = fStack_1114 * fVar113;
              fStack_1170 = fStack_1110 * fVar114;
              fStack_116c = fStack_110c * fVar115;
              fStack_1168 = fStack_1108 * fVar116;
              uStack_1164 = uStack_1104;
              auVar73 = vpmovsxwd_avx2(auVar82);
              auVar89._8_4_ = 0x7f800000;
              auVar89._0_8_ = 0x7f8000007f800000;
              auVar89._12_4_ = 0x7f800000;
              auVar89._16_4_ = 0x7f800000;
              auVar89._20_4_ = 0x7f800000;
              auVar89._24_4_ = 0x7f800000;
              auVar89._28_4_ = 0x7f800000;
              auVar73 = vblendvps_avx(auVar89,local_11e0,auVar73);
              auVar74 = vshufps_avx(auVar73,auVar73,0xb1);
              auVar74 = vminps_avx(auVar73,auVar74);
              auVar79 = vshufpd_avx(auVar74,auVar74,5);
              auVar74 = vminps_avx(auVar74,auVar79);
              auVar79 = vpermpd_avx2(auVar74,0x4e);
              auVar74 = vminps_avx(auVar74,auVar79);
              auVar73 = vcmpps_avx(auVar73,auVar74,0);
              auVar71 = vpackssdw_avx(auVar73._0_16_,auVar73._16_16_);
              auVar71 = vpand_avx(auVar71,auVar82);
              auVar73 = vpmovsxwd_avx2(auVar71);
              if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar73 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar73 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar73 >> 0x7f,0) == '\0') &&
                    (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar73 >> 0xbf,0) == '\0') &&
                  (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar73[0x1f]) {
                auVar73 = local_15e0;
              }
              auVar120 = ZEXT3264(auVar73);
              auVar73 = vpcmpeqd_avx2(auVar75,auVar75);
              auVar123 = ZEXT3264(auVar73);
              fStack_150c = fStack_1510;
              fStack_1508 = fStack_1510;
              fStack_1504 = fStack_1510;
LAB_00600536:
              uVar38 = vmovmskps_avx(auVar120._0_32_);
              uVar42 = 0;
              for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x80000000) {
                uVar42 = uVar42 + 1;
              }
              uVar51 = (ulong)uVar42;
              uVar38 = *(uint *)((long)&local_10e0 + uVar51 * 4);
              pGVar5 = (pSVar3->geometries).items[uVar38].ptr;
              if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_15e0 + uVar51 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar51 = (ulong)(uVar42 << 2);
                  uVar1 = *(undefined4 *)(local_1220 + uVar51);
                  uVar2 = *(undefined4 *)(local_1200 + uVar51);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_11e0 + uVar51);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)((long)local_11c0 + uVar51);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)((long)local_11a0 + uVar51);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)((long)local_1180 + uVar51);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar1;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x220) = *(undefined4 *)((long)&local_1320 + uVar51)
                  ;
                  *(uint *)(ray + k * 4 + 0x240) = uVar38;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  goto LAB_00600961;
                }
                uVar44 = (ulong)(uVar42 * 4);
                local_1060 = *(undefined4 *)(local_1220 + uVar44);
                local_1040 = *(undefined4 *)(local_1200 + uVar44);
                local_1020 = *(undefined4 *)((long)&local_1320 + uVar44);
                uVar1 = *(undefined4 *)((long)local_11c0 + uVar44);
                uVar2 = *(undefined4 *)((long)local_11a0 + uVar44);
                local_10a0._4_4_ = uVar2;
                local_10a0._0_4_ = uVar2;
                local_10a0._8_4_ = uVar2;
                local_10a0._12_4_ = uVar2;
                local_10a0._16_4_ = uVar2;
                local_10a0._20_4_ = uVar2;
                local_10a0._24_4_ = uVar2;
                local_10a0._28_4_ = uVar2;
                uVar2 = *(undefined4 *)((long)local_1180 + uVar44);
                local_1080._4_4_ = uVar2;
                local_1080._0_4_ = uVar2;
                local_1080._8_4_ = uVar2;
                local_1080._12_4_ = uVar2;
                local_1080._16_4_ = uVar2;
                local_1080._20_4_ = uVar2;
                local_1080._24_4_ = uVar2;
                local_1080._28_4_ = uVar2;
                local_1000._4_4_ = uVar38;
                local_1000._0_4_ = uVar38;
                local_1000._8_4_ = uVar38;
                local_1000._12_4_ = uVar38;
                local_1000._16_4_ = uVar38;
                local_1000._20_4_ = uVar38;
                local_1000._24_4_ = uVar38;
                local_1000._28_4_ = uVar38;
                local_10c0[0] = (RTCHitN)(char)uVar1;
                local_10c0[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_10c0[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_10c0[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_10c0[4] = (RTCHitN)(char)uVar1;
                local_10c0[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_10c0[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_10c0[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_10c0[8] = (RTCHitN)(char)uVar1;
                local_10c0[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_10c0[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_10c0[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_10c0[0xc] = (RTCHitN)(char)uVar1;
                local_10c0[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_10c0[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_10c0[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_10c0[0x10] = (RTCHitN)(char)uVar1;
                local_10c0[0x11] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_10c0[0x12] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_10c0[0x13] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_10c0[0x14] = (RTCHitN)(char)uVar1;
                local_10c0[0x15] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_10c0[0x16] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_10c0[0x17] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_10c0[0x18] = (RTCHitN)(char)uVar1;
                local_10c0[0x19] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_10c0[0x1a] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_10c0[0x1b] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_10c0[0x1c] = (RTCHitN)(char)uVar1;
                local_10c0[0x1d] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_10c0[0x1e] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_10c0[0x1f] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                uStack_105c = local_1060;
                uStack_1058 = local_1060;
                uStack_1054 = local_1060;
                uStack_1050 = local_1060;
                uStack_104c = local_1060;
                uStack_1048 = local_1060;
                uStack_1044 = local_1060;
                uStack_103c = local_1040;
                uStack_1038 = local_1040;
                uStack_1034 = local_1040;
                uStack_1030 = local_1040;
                uStack_102c = local_1040;
                uStack_1028 = local_1040;
                uStack_1024 = local_1040;
                uStack_101c = local_1020;
                uStack_1018 = local_1020;
                uStack_1014 = local_1020;
                uStack_1010 = local_1020;
                uStack_100c = local_1020;
                uStack_1008 = local_1020;
                uStack_1004 = local_1020;
                uStack_fdc = context->user->instID[0];
                local_fe0 = uStack_fdc;
                uStack_fd8 = uStack_fdc;
                uStack_fd4 = uStack_fdc;
                uStack_fd0 = uStack_fdc;
                uStack_fcc = uStack_fdc;
                uStack_fc8 = uStack_fdc;
                uStack_fc4 = uStack_fdc;
                uStack_fbc = context->user->instPrimID[0];
                local_fc0 = uStack_fbc;
                uStack_fb8 = uStack_fbc;
                uStack_fb4 = uStack_fbc;
                uStack_fb0 = uStack_fbc;
                uStack_fac = uStack_fbc;
                uStack_fa8 = uStack_fbc;
                uStack_fa4 = uStack_fbc;
                uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_11e0 + uVar44);
                local_1440 = local_1140._0_8_;
                uStack_1438 = local_1140._8_8_;
                uStack_1430 = local_1140._16_8_;
                uStack_1428 = local_1140._24_8_;
                local_1610.valid = (int *)&local_1440;
                local_1610.geometryUserPtr = pGVar5->userPtr;
                local_1610.context = context->user;
                local_1610.hit = local_10c0;
                local_1610.N = 8;
                local_1610.ray = (RTCRayN *)ray;
                if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar73 = ZEXT1632(auVar123._0_16_);
                  (*pGVar5->intersectionFilterN)(&local_1610);
                  auVar69 = ZEXT3264(auVar69._0_32_);
                  auVar73 = vpcmpeqd_avx2(auVar73,auVar73);
                  auVar123 = ZEXT3264(auVar73);
                }
                auVar34._8_8_ = uStack_1438;
                auVar34._0_8_ = local_1440;
                auVar34._16_8_ = uStack_1430;
                auVar34._24_8_ = uStack_1428;
                auVar74 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar34);
                auVar73 = auVar123._0_32_ & ~auVar74;
                if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar73 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar73 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar73 >> 0x7f,0) == '\0') &&
                      (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar73 >> 0xbf,0) == '\0') &&
                    (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar73[0x1f]) {
                  auVar74 = auVar74 ^ auVar123._0_32_;
                }
                else {
                  p_Var9 = context->args->filter;
                  if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar73 = ZEXT1632(auVar123._0_16_);
                    (*p_Var9)(&local_1610);
                    auVar69 = ZEXT3264(auVar69._0_32_);
                    auVar73 = vpcmpeqd_avx2(auVar73,auVar73);
                    auVar123 = ZEXT3264(auVar73);
                  }
                  auVar35._8_8_ = uStack_1438;
                  auVar35._0_8_ = local_1440;
                  auVar35._16_8_ = uStack_1430;
                  auVar35._24_8_ = uStack_1428;
                  auVar79 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar35);
                  auVar74 = auVar79 ^ auVar123._0_32_;
                  auVar73 = auVar123._0_32_ & ~auVar79;
                  if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar73 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar73 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar73 >> 0x7f,0) != '\0') ||
                        (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar73 >> 0xbf,0) != '\0') ||
                      (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar73[0x1f] < '\0') {
                    auVar81._0_4_ = auVar79._0_4_ ^ auVar123._0_4_;
                    auVar81._4_4_ = auVar79._4_4_ ^ auVar123._4_4_;
                    auVar81._8_4_ = auVar79._8_4_ ^ auVar123._8_4_;
                    auVar81._12_4_ = auVar79._12_4_ ^ auVar123._12_4_;
                    auVar81._16_4_ = auVar79._16_4_ ^ auVar123._16_4_;
                    auVar81._20_4_ = auVar79._20_4_ ^ auVar123._20_4_;
                    auVar81._24_4_ = auVar79._24_4_ ^ auVar123._24_4_;
                    auVar81._28_4_ = auVar79._28_4_ ^ auVar123._28_4_;
                    auVar73 = vmaskmovps_avx(auVar81,*(undefined1 (*) [32])local_1610.hit);
                    *(undefined1 (*) [32])(local_1610.ray + 0x180) = auVar73;
                    auVar73 = vmaskmovps_avx(auVar81,*(undefined1 (*) [32])(local_1610.hit + 0x20));
                    *(undefined1 (*) [32])(local_1610.ray + 0x1a0) = auVar73;
                    auVar73 = vmaskmovps_avx(auVar81,*(undefined1 (*) [32])(local_1610.hit + 0x40));
                    *(undefined1 (*) [32])(local_1610.ray + 0x1c0) = auVar73;
                    auVar73 = vmaskmovps_avx(auVar81,*(undefined1 (*) [32])(local_1610.hit + 0x60));
                    *(undefined1 (*) [32])(local_1610.ray + 0x1e0) = auVar73;
                    auVar73 = vmaskmovps_avx(auVar81,*(undefined1 (*) [32])(local_1610.hit + 0x80));
                    *(undefined1 (*) [32])(local_1610.ray + 0x200) = auVar73;
                    auVar73 = vpmaskmovd_avx2(auVar81,*(undefined1 (*) [32])(local_1610.hit + 0xa0))
                    ;
                    *(undefined1 (*) [32])(local_1610.ray + 0x220) = auVar73;
                    auVar73 = vpmaskmovd_avx2(auVar81,*(undefined1 (*) [32])(local_1610.hit + 0xc0))
                    ;
                    *(undefined1 (*) [32])(local_1610.ray + 0x240) = auVar73;
                    auVar73 = vpmaskmovd_avx2(auVar81,*(undefined1 (*) [32])(local_1610.hit + 0xe0))
                    ;
                    *(undefined1 (*) [32])(local_1610.ray + 0x260) = auVar73;
                    auVar73 = vpmaskmovd_avx2(auVar81,*(undefined1 (*) [32])(local_1610.hit + 0x100)
                                             );
                    *(undefined1 (*) [32])(local_1610.ray + 0x280) = auVar73;
                  }
                }
                if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar74 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar74 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar74 >> 0x7f,0) == '\0') &&
                      (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar74 >> 0xbf,0) == '\0') &&
                    (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar74[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar1;
                }
                *(undefined4 *)(local_15e0 + uVar51 * 4) = 0;
                uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar68._4_4_ = uVar1;
                auVar68._0_4_ = uVar1;
                auVar68._8_4_ = uVar1;
                auVar68._12_4_ = uVar1;
                auVar68._16_4_ = uVar1;
                auVar68._20_4_ = uVar1;
                auVar68._24_4_ = uVar1;
                auVar68._28_4_ = uVar1;
                auVar73 = vcmpps_avx(auVar69._0_32_,auVar68,2);
                local_15e0 = vandps_avx(auVar73,local_15e0);
              }
              auVar120 = ZEXT3264(local_15e0);
              if ((((((((local_15e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_15e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_15e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_15e0 >> 0x7f,0) == '\0') &&
                    (local_15e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_15e0 >> 0xbf,0) == '\0') &&
                  (local_15e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_15e0[0x1f]) goto LAB_00600961;
              auVar80._8_4_ = 0x7f800000;
              auVar80._0_8_ = 0x7f8000007f800000;
              auVar80._12_4_ = 0x7f800000;
              auVar80._16_4_ = 0x7f800000;
              auVar80._20_4_ = 0x7f800000;
              auVar80._24_4_ = 0x7f800000;
              auVar80._28_4_ = 0x7f800000;
              auVar73 = vblendvps_avx(auVar80,auVar69._0_32_,local_15e0);
              auVar74 = vshufps_avx(auVar73,auVar73,0xb1);
              auVar74 = vminps_avx(auVar73,auVar74);
              auVar79 = vshufpd_avx(auVar74,auVar74,5);
              auVar74 = vminps_avx(auVar74,auVar79);
              auVar79 = vpermpd_avx2(auVar74,0x4e);
              auVar74 = vminps_avx(auVar74,auVar79);
              auVar73 = vcmpps_avx(auVar73,auVar74,0);
              auVar74 = local_15e0 & auVar73;
              if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar74 >> 0x7f,0) != '\0') ||
                    (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar74 >> 0xbf,0) != '\0') ||
                  (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar74[0x1f] < '\0') {
                auVar73 = vandps_avx(auVar73,local_15e0);
                auVar120 = ZEXT3264(auVar73);
              }
              goto LAB_00600536;
            }
          }
        }
LAB_00600961:
        lVar41 = lVar41 + 1;
      } while (lVar41 != uVar39 - 8);
    }
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar69 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
    auVar123 = ZEXT1664(local_1390);
    auVar129 = ZEXT1664(local_13a0);
    auVar139 = ZEXT1664(local_13b0);
    auVar120 = ZEXT1664(local_15b0);
    fVar140 = local_13c0;
    fVar143 = fStack_13bc;
    fVar144 = fStack_13b8;
    fVar145 = fStack_13b4;
    fVar146 = local_13d0;
    fVar148 = fStack_13cc;
    fVar149 = fStack_13c8;
    fVar105 = fStack_13c4;
    fVar111 = local_13e0;
    fVar112 = fStack_13dc;
    fVar113 = fStack_13d8;
    fVar114 = fStack_13d4;
    fVar115 = local_13f0;
    fVar116 = fStack_13ec;
    fVar151 = fStack_13e8;
    fVar152 = fStack_13e4;
    fVar153 = local_1400;
    fVar157 = fStack_13fc;
    fVar158 = fStack_13f8;
    fVar159 = fStack_13f4;
    fVar160 = local_1410;
    fVar163 = fStack_140c;
    fVar164 = fStack_1408;
    fVar165 = fStack_1404;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }